

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-getsockname.c
# Opt level: O0

int run_test_pipe_getsockname_abstract(void)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  uv_loop_t *loop;
  undefined8 local_497;
  char abstract_pipe [11];
  socklen_t sun_len;
  sockaddr_un sun;
  int sock;
  int r;
  size_t len;
  char buf [1024];
  
  local_497 = 0x69702d7473657400;
  abstract_pipe[0] = 'p';
  abstract_pipe[1] = 'e';
  abstract_pipe[2] = '\0';
  iVar1 = socket(1,1,0);
  if (iVar1 == -1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-getsockname.c"
            ,0xaf,"sock != -1");
    abort();
  }
  abstract_pipe[3] = 'n';
  abstract_pipe[4] = '\0';
  abstract_pipe[5] = '\0';
  abstract_pipe[6] = '\0';
  memset(abstract_pipe + 9,0,0x6e);
  abstract_pipe[9] = '\x01';
  abstract_pipe[10] = '\0';
  iVar2 = bind(iVar1,(sockaddr *)(abstract_pipe + 9),abstract_pipe._3_4_);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-getsockname.c"
            ,0xb7,"r == 0");
    abort();
  }
  uVar3 = uv_default_loop();
  iVar2 = uv_pipe_init(uVar3,&pipe_server,0);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-getsockname.c"
            ,0xba,"r == 0");
    abort();
  }
  iVar2 = uv_pipe_open(&pipe_server,iVar1);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-getsockname.c"
            ,0xbc,"r == 0");
    abort();
  }
  _sock = 0x400;
  iVar2 = uv_pipe_getsockname(&pipe_server,&len,&sock);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-getsockname.c"
            ,0xc0,"r == 0");
    abort();
  }
  iVar2 = memcmp(&len,&local_497,0xb);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-getsockname.c"
            ,0xc2,"memcmp(buf, abstract_pipe, sizeof abstract_pipe) == 0");
    abort();
  }
  uv_close(&pipe_server,pipe_close_cb);
  uVar3 = uv_default_loop();
  uv_run(uVar3,0);
  close(iVar1);
  if (pipe_close_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-getsockname.c"
            ,0xca,"pipe_close_cb_called == 1");
    abort();
  }
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar3 = uv_default_loop();
  iVar1 = uv_loop_close(uVar3);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-getsockname.c"
            ,0xcb,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(pipe_getsockname_abstract) {
#if defined(__linux__)
  char buf[1024];
  size_t len;
  int r;
  int sock;
  struct sockaddr_un sun;
  socklen_t sun_len;
  char abstract_pipe[] = "\0test-pipe";

  sock = socket(AF_UNIX, SOCK_STREAM, 0);
  ASSERT(sock != -1);

  sun_len = sizeof sun;
  memset(&sun, 0, sun_len);
  sun.sun_family = AF_UNIX;
  memcpy(sun.sun_path, abstract_pipe, sizeof abstract_pipe);

  r = bind(sock, (struct sockaddr*)&sun, sun_len);
  ASSERT(r == 0);

  r = uv_pipe_init(uv_default_loop(), &pipe_server, 0);
  ASSERT(r == 0);
  r = uv_pipe_open(&pipe_server, sock);
  ASSERT(r == 0);

  len = sizeof buf;
  r = uv_pipe_getsockname(&pipe_server, buf, &len);
  ASSERT(r == 0);

  ASSERT(memcmp(buf, abstract_pipe, sizeof abstract_pipe) == 0);

  uv_close((uv_handle_t*)&pipe_server, pipe_close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  close(sock);

  ASSERT(pipe_close_cb_called == 1);
  MAKE_VALGRIND_HAPPY();
  return 0;
#else
  MAKE_VALGRIND_HAPPY();
  return 0;
#endif
}